

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O1

string * __thiscall
KMeans::genKMeansFunction_abi_cxx11_(string *__return_storage_ptr__,KMeans *this)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long lVar4;
  string *psVar5;
  long *plVar6;
  undefined8 *puVar7;
  Attribute *pAVar8;
  mapped_type *pmVar9;
  size_type *psVar10;
  long *plVar11;
  ulong uVar12;
  ulong *puVar13;
  char cVar14;
  ushort uVar15;
  byte bVar26;
  char cVar27;
  byte bVar28;
  char cVar29;
  byte bVar30;
  char cVar31;
  byte bVar32;
  char cVar33;
  byte bVar34;
  undefined1 auVar24 [16];
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  string origView;
  string categUpdates;
  string gridViewName;
  string numCategVar;
  string returnString;
  ulong *local_b00;
  long local_af8;
  ulong local_af0;
  long lStack_ae8;
  ulong *local_ae0;
  long local_ad8;
  ulong local_ad0;
  long lStack_ac8;
  long *local_ac0;
  long local_ab8;
  long local_ab0;
  long lStack_aa8;
  ulong *local_aa0;
  long local_a98;
  ulong local_a90;
  long lStack_a88;
  ulong *local_a80;
  long local_a78;
  ulong local_a70;
  long lStack_a68;
  long *local_a60;
  long local_a58;
  long local_a50;
  long lStack_a48;
  ulong *local_a40;
  long local_a38;
  ulong local_a30;
  long lStack_a28;
  ulong *local_a20;
  long local_a18;
  ulong local_a10;
  long lStack_a08;
  ulong *local_a00;
  long local_9f8;
  ulong local_9f0;
  long lStack_9e8;
  ulong *local_9e0;
  long local_9d8;
  ulong local_9d0;
  long lStack_9c8;
  ulong *local_9c0;
  long local_9b8;
  ulong local_9b0;
  long lStack_9a8;
  ulong *local_9a0;
  long local_998;
  ulong local_990;
  long lStack_988;
  ulong *local_980;
  long local_978;
  ulong local_970;
  long lStack_968;
  ulong *local_960;
  long local_958;
  ulong local_950;
  long lStack_948;
  string local_940;
  undefined8 *local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined8 uStack_908;
  ulong *local_900;
  long local_8f8;
  ulong local_8f0;
  long lStack_8e8;
  ulong *local_8e0;
  long local_8d8;
  ulong local_8d0;
  long lStack_8c8;
  ulong *local_8c0;
  long local_8b8;
  ulong local_8b0;
  undefined8 uStack_8a8;
  string local_8a0;
  ulong *local_880;
  long local_878;
  ulong local_870;
  long lStack_868;
  ulong *local_860;
  long local_858;
  ulong local_850;
  long lStack_848;
  ulong *local_840;
  long local_838;
  ulong local_830;
  long lStack_828;
  ulong *local_820;
  long local_818;
  ulong local_810;
  long lStack_808;
  ulong *local_800;
  long local_7f8;
  ulong local_7f0;
  long lStack_7e8;
  ulong *local_7e0;
  long local_7d8;
  ulong local_7d0;
  long lStack_7c8;
  undefined8 *local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  char *local_7a0;
  uint local_798;
  char local_790 [16];
  ulong *local_780;
  long local_778;
  ulong local_770;
  undefined8 uStack_768;
  ulong *local_760;
  long local_758;
  ulong local_750;
  long lStack_748;
  ulong *local_740;
  long local_738;
  ulong local_730;
  undefined8 uStack_728;
  ulong *local_720;
  long local_718;
  ulong local_710;
  long lStack_708;
  ulong *local_700;
  long local_6f8;
  ulong local_6f0;
  long lStack_6e8;
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  ulong *local_6c0;
  long local_6b8;
  ulong local_6b0;
  long lStack_6a8;
  ulong *local_6a0;
  long local_698;
  ulong local_690;
  long lStack_688;
  ulong *local_680;
  long local_678;
  ulong local_670;
  long lStack_668;
  ulong *local_660;
  long local_658;
  ulong local_650;
  long lStack_648;
  ulong *local_640;
  long local_638;
  ulong local_630;
  long lStack_628;
  ulong *local_620;
  long local_618;
  ulong local_610;
  long lStack_608;
  ulong *local_600;
  long local_5f8;
  ulong local_5f0;
  long lStack_5e8;
  ulong *local_5e0;
  long local_5d8;
  ulong local_5d0;
  long lStack_5c8;
  ulong *local_5c0;
  long local_5b8;
  ulong local_5b0;
  long lStack_5a8;
  ulong *local_5a0;
  long local_598;
  ulong local_590;
  long lStack_588;
  ulong *local_580;
  long local_578;
  ulong local_570;
  long lStack_568;
  ulong *local_560;
  long local_558;
  ulong local_550;
  long lStack_548;
  ulong *local_540;
  long local_538;
  ulong local_530 [2];
  ulong *local_520;
  long local_518;
  ulong local_510 [2];
  ulong *local_500;
  long local_4f8;
  ulong local_4f0 [2];
  ulong *local_4e0;
  long local_4d8;
  ulong local_4d0 [2];
  ulong *local_4c0;
  long local_4b8;
  ulong local_4b0 [2];
  ulong *local_4a0;
  long local_498;
  ulong local_490 [2];
  ulong *local_480;
  long local_478;
  ulong local_470 [2];
  ulong *local_460;
  long local_458;
  ulong local_450 [2];
  ulong *local_440;
  long local_438;
  ulong local_430 [2];
  ulong *local_420;
  long local_418;
  ulong local_410 [2];
  ulong *local_400;
  long local_3f8;
  ulong local_3f0 [2];
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0 [2];
  ulong *local_3c0;
  long local_3b8;
  ulong local_3b0 [2];
  ulong *local_3a0;
  long local_398;
  ulong local_390 [2];
  ulong *local_380;
  long local_378;
  ulong local_370 [2];
  ulong *local_360;
  long local_358;
  ulong local_350;
  long lStack_348;
  ulong *local_340;
  long local_338;
  ulong local_330 [2];
  ulong *local_320;
  long local_318;
  ulong local_310 [2];
  ulong *local_300;
  long local_2f8;
  ulong local_2f0 [2];
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0 [2];
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  ulong *local_120;
  long local_118;
  ulong local_110 [2];
  ulong *local_100;
  long local_f8;
  ulong local_f0 [2];
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  string *local_60;
  View *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  undefined4 uVar16;
  undefined6 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  
  puVar13 = *(ulong **)
             &((*(countQuery->_aggregates).
                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                 super__Vector_impl_data._M_start)->_incoming).
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data;
  uVar12 = *puVar13;
  cVar14 = '\x01';
  if (9 < uVar12) {
    uVar35 = uVar12;
    cVar27 = '\x04';
    do {
      cVar14 = cVar27;
      if (uVar35 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_001c8fc6;
      }
      if (uVar35 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_001c8fc6;
      }
      if (uVar35 < 10000) goto LAB_001c8fc6;
      bVar3 = 99999 < uVar35;
      uVar35 = uVar35 / 10000;
      cVar27 = cVar14 + '\x04';
    } while (bVar3);
    cVar14 = cVar14 + '\x01';
  }
LAB_001c8fc6:
  local_7a0 = local_790;
  std::__cxx11::string::_M_construct((ulong)&local_7a0,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_7a0,local_798,uVar12);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_7a0,0,(char *)0x0,0x2a8219);
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_8a0.field_2._M_allocated_capacity = *psVar10;
    local_8a0.field_2._8_8_ = plVar6[3];
  }
  else {
    local_8a0.field_2._M_allocated_capacity = *psVar10;
    local_8a0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_8a0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_7a0 != local_790) {
    operator_delete(local_7a0);
  }
  local_58 = QueryCompiler::getView
                       ((this->_compiler).
                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        *puVar13);
  auVar24 = *(undefined1 (*) [16])
             (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w;
  auVar36._0_2_ = auVar24._0_2_ >> 1;
  auVar36._2_2_ = auVar24._2_2_ >> 1;
  auVar36._4_2_ = auVar24._4_2_ >> 1;
  auVar36._6_2_ = auVar24._6_2_ >> 1;
  auVar36._8_2_ = auVar24._8_2_ >> 1;
  auVar36._10_2_ = auVar24._10_2_ >> 1;
  auVar36._12_2_ = auVar24._12_2_ >> 1;
  auVar36._14_2_ = auVar24._14_2_ >> 1;
  auVar36 = auVar36 & _DAT_002b0050;
  uVar15 = CONCAT11(auVar24[1] - auVar36[1],auVar24[0] - auVar36[0]);
  uVar16 = CONCAT13(auVar24[3] - auVar36[3],CONCAT12(auVar24[2] - auVar36[2],uVar15));
  uVar17 = CONCAT15(auVar24[5] - auVar36[5],CONCAT14(auVar24[4] - auVar36[4],uVar16));
  uVar18 = CONCAT17(auVar24[7] - auVar36[7],CONCAT16(auVar24[6] - auVar36[6],uVar17));
  auVar19._0_10_ = CONCAT19(auVar24[9] - auVar36[9],CONCAT18(auVar24[8] - auVar36[8],uVar18));
  auVar19[10] = auVar24[10] - auVar36[10];
  auVar19[0xb] = auVar24[0xb] - auVar36[0xb];
  auVar21[0xc] = auVar24[0xc] - auVar36[0xc];
  auVar21._0_12_ = auVar19;
  auVar21[0xd] = auVar24[0xd] - auVar36[0xd];
  auVar23[0xe] = auVar24[0xe] - auVar36[0xe];
  auVar23._0_14_ = auVar21;
  auVar23[0xf] = auVar24[0xf] - auVar36[0xf];
  auVar36 = auVar23 & _DAT_002b0060;
  auVar24._0_2_ = uVar15 >> 2;
  auVar24._2_2_ = (ushort)((uint)uVar16 >> 0x12);
  auVar24._4_2_ = (ushort)((uint6)uVar17 >> 0x22);
  auVar24._6_2_ = (ushort)((ulong)uVar18 >> 0x32);
  auVar24._8_2_ = (ushort)((unkuint10)auVar19._0_10_ >> 0x42);
  auVar24._10_2_ = auVar19._10_2_ >> 2;
  auVar24._12_2_ = auVar21._12_2_ >> 2;
  auVar24._14_2_ = auVar23._14_2_ >> 2;
  auVar24 = auVar24 & _DAT_002b0060;
  cVar14 = auVar24[0] + auVar36[0];
  bVar26 = auVar24[1] + auVar36[1];
  uVar15 = CONCAT11(bVar26,cVar14);
  cVar27 = auVar24[2] + auVar36[2];
  bVar28 = auVar24[3] + auVar36[3];
  uVar16 = CONCAT13(bVar28,CONCAT12(cVar27,uVar15));
  cVar29 = auVar24[4] + auVar36[4];
  bVar30 = auVar24[5] + auVar36[5];
  uVar17 = CONCAT15(bVar30,CONCAT14(cVar29,uVar16));
  cVar31 = auVar24[6] + auVar36[6];
  bVar32 = auVar24[7] + auVar36[7];
  uVar18 = CONCAT17(bVar32,CONCAT16(cVar31,uVar17));
  cVar33 = auVar24[8] + auVar36[8];
  bVar34 = auVar24[9] + auVar36[9];
  auVar20._0_10_ = CONCAT19(bVar34,CONCAT18(cVar33,uVar18));
  auVar20[10] = auVar24[10] + auVar36[10];
  auVar20[0xb] = auVar24[0xb] + auVar36[0xb];
  auVar22[0xc] = auVar24[0xc] + auVar36[0xc];
  auVar22._0_12_ = auVar20;
  auVar22[0xd] = auVar24[0xd] + auVar36[0xd];
  auVar25[0xe] = auVar24[0xe] + auVar36[0xe];
  auVar25._0_14_ = auVar22;
  auVar25[0xf] = auVar24[0xf] + auVar36[0xf];
  auVar37[0] = (char)(uVar15 >> 4) + cVar14;
  auVar37[1] = (bVar26 >> 4) + bVar26;
  auVar37[2] = (char)(ushort)((uint)uVar16 >> 0x14) + cVar27;
  auVar37[3] = (bVar28 >> 4) + bVar28;
  auVar37[4] = (char)(ushort)((uint6)uVar17 >> 0x24) + cVar29;
  auVar37[5] = (bVar30 >> 4) + bVar30;
  auVar37[6] = (char)(ushort)((ulong)uVar18 >> 0x34) + cVar31;
  auVar37[7] = (bVar32 >> 4) + bVar32;
  auVar37[8] = (char)(ushort)((unkuint10)auVar20._0_10_ >> 0x44) + cVar33;
  auVar37[9] = (bVar34 >> 4) + bVar34;
  auVar37[10] = (char)(auVar20._10_2_ >> 4) + auVar20[10];
  auVar37[0xb] = (auVar20[0xb] >> 4) + auVar20[0xb];
  auVar37[0xc] = (char)(auVar22._12_2_ >> 4) + auVar22[0xc];
  auVar37[0xd] = (auVar22[0xd] >> 4) + auVar22[0xd];
  auVar37[0xe] = (char)(auVar25._14_2_ >> 4) + auVar25[0xe];
  auVar37[0xf] = (auVar25[0xf] >> 4) + auVar25[0xf];
  auVar24 = psadbw((undefined1  [16])0x0,auVar37 & _DAT_002b0070);
  uVar35 = auVar24._8_8_ + auVar24._0_8_;
  uVar12 = uVar35 >> 1 & 0x7fffffff;
  cVar14 = '\x01';
  if (0x13 < uVar35) {
    uVar35 = uVar12;
    cVar27 = '\x04';
    do {
      cVar14 = cVar27;
      if (uVar35 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_001c914c;
      }
      if (uVar35 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_001c914c;
      }
      if (uVar35 < 10000) goto LAB_001c914c;
      bVar3 = 99999 < uVar35;
      uVar35 = uVar35 / 10000;
      cVar27 = cVar14 + '\x04';
    } while (bVar3);
    cVar14 = cVar14 + '\x01';
  }
LAB_001c914c:
  local_7a0 = local_790;
  std::__cxx11::string::_M_construct((ulong)&local_7a0,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_7a0,local_798,uVar12);
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"\n","");
  local_780 = &local_770;
  std::__cxx11::string::_M_construct((ulong)&local_780,'\x03');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_780);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_7f0 = *puVar13;
    lStack_7e8 = plVar6[3];
    local_800 = &local_7f0;
  }
  else {
    local_7f0 = *puVar13;
    local_800 = (ulong *)*plVar6;
  }
  local_7f8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_7e0 = &local_7d0;
  std::__cxx11::string::_M_construct((ulong)&local_7e0,'\x03');
  uVar12 = 0xf;
  if (local_800 != &local_7f0) {
    uVar12 = local_7f0;
  }
  if (uVar12 < (ulong)(local_7d8 + local_7f8)) {
    uVar12 = 0xf;
    if (local_7e0 != &local_7d0) {
      uVar12 = local_7d0;
    }
    if (uVar12 < (ulong)(local_7d8 + local_7f8)) goto LAB_001c929c;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_7e0,0,(char *)0x0,(ulong)local_800);
  }
  else {
LAB_001c929c:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_7e0);
  }
  local_7c0 = &local_7b0;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_7b0 = *puVar1;
    uStack_7a8 = puVar7[3];
  }
  else {
    local_7b0 = *puVar1;
    local_7c0 = (undefined8 *)*puVar7;
  }
  local_7b8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_7c0);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_870 = *puVar13;
    lStack_868 = plVar6[3];
    local_880 = &local_870;
  }
  else {
    local_870 = *puVar13;
    local_880 = (ulong *)*plVar6;
  }
  local_878 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_760 = &local_750;
  local_60 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_760,'\x06');
  uVar12 = 0xf;
  if (local_880 != &local_870) {
    uVar12 = local_870;
  }
  if (uVar12 < (ulong)(local_758 + local_878)) {
    uVar12 = 0xf;
    if (local_760 != &local_750) {
      uVar12 = local_750;
    }
    if (uVar12 < (ulong)(local_758 + local_878)) goto LAB_001c9400;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_760,0,(char *)0x0,(ulong)local_880);
  }
  else {
LAB_001c9400:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_880,(ulong)local_760);
  }
  local_920 = &local_910;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_910 = *puVar1;
    uStack_908 = puVar7[3];
  }
  else {
    local_910 = *puVar1;
    local_920 = (undefined8 *)*puVar7;
  }
  local_918 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_920);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_850 = *puVar13;
    lStack_848 = plVar6[3];
    local_860 = &local_850;
  }
  else {
    local_850 = *puVar13;
    local_860 = (ulong *)*plVar6;
  }
  local_858 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_860);
  local_900 = &local_8f0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_8f0 = *puVar13;
    lStack_8e8 = plVar6[3];
  }
  else {
    local_8f0 = *puVar13;
    local_900 = (ulong *)*plVar6;
  }
  local_8f8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_820 = &local_810;
  std::__cxx11::string::_M_construct((ulong)&local_820,'\x06');
  uVar12 = 0xf;
  if (local_900 != &local_8f0) {
    uVar12 = local_8f0;
  }
  if (uVar12 < (ulong)(local_818 + local_8f8)) {
    uVar12 = 0xf;
    if (local_820 != &local_810) {
      uVar12 = local_810;
    }
    if (uVar12 < (ulong)(local_818 + local_8f8)) goto LAB_001c95c9;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_820,0,(char *)0x0,(ulong)local_900);
  }
  else {
LAB_001c95c9:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_900,(ulong)local_820);
  }
  local_8e0 = &local_8d0;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_8d0 = *puVar13;
    lStack_8c8 = puVar7[3];
  }
  else {
    local_8d0 = *puVar13;
    local_8e0 = (ulong *)*puVar7;
  }
  local_8d8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_8e0);
  local_960 = &local_950;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_950 = *puVar13;
    lStack_948 = plVar6[3];
  }
  else {
    local_950 = *puVar13;
    local_960 = (ulong *)*plVar6;
  }
  local_958 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_960,(ulong)local_8a0._M_dataplus._M_p);
  local_980 = &local_970;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_970 = *puVar13;
    lStack_968 = plVar6[3];
  }
  else {
    local_970 = *puVar13;
    local_980 = (ulong *)*plVar6;
  }
  local_978 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_980);
  local_9c0 = &local_9b0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_9b0 = *puVar13;
    lStack_9a8 = plVar6[3];
  }
  else {
    local_9b0 = *puVar13;
    local_9c0 = (ulong *)*plVar6;
  }
  local_9b8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_840 = &local_830;
  std::__cxx11::string::_M_construct((ulong)&local_840,'\x06');
  uVar12 = 0xf;
  if (local_9c0 != &local_9b0) {
    uVar12 = local_9b0;
  }
  if (uVar12 < (ulong)(local_838 + local_9b8)) {
    uVar12 = 0xf;
    if (local_840 != &local_830) {
      uVar12 = local_830;
    }
    if (uVar12 < (ulong)(local_838 + local_9b8)) goto LAB_001c97fe;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_840,0,(char *)0x0,(ulong)local_9c0);
  }
  else {
LAB_001c97fe:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9c0,(ulong)local_840);
  }
  local_a00 = &local_9f0;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_9f0 = *puVar13;
    lStack_9e8 = puVar7[3];
  }
  else {
    local_9f0 = *puVar13;
    local_a00 = (ulong *)*puVar7;
  }
  local_9f8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a00);
  local_a20 = &local_a10;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a10 = *puVar13;
    lStack_a08 = plVar6[3];
  }
  else {
    local_a10 = *puVar13;
    local_a20 = (ulong *)*plVar6;
  }
  local_a18 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_8c0 = &local_8b0;
  std::__cxx11::string::_M_construct((ulong)&local_8c0,'\x06');
  uVar12 = 0xf;
  if (local_a20 != &local_a10) {
    uVar12 = local_a10;
  }
  if (uVar12 < (ulong)(local_8b8 + local_a18)) {
    uVar12 = 0xf;
    if (local_8c0 != &local_8b0) {
      uVar12 = local_8b0;
    }
    if (uVar12 < (ulong)(local_8b8 + local_a18)) goto LAB_001c9964;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_8c0,0,(char *)0x0,(ulong)local_a20);
  }
  else {
LAB_001c9964:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a20,(ulong)local_8c0);
  }
  local_9a0 = &local_990;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_990 = *puVar13;
    lStack_988 = puVar7[3];
  }
  else {
    local_990 = *puVar13;
    local_9a0 = (ulong *)*puVar7;
  }
  local_998 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_9a0);
  local_9e0 = &local_9d0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_9d0 = *puVar13;
    lStack_9c8 = plVar6[3];
  }
  else {
    local_9d0 = *puVar13;
    local_9e0 = (ulong *)*plVar6;
  }
  local_9d8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_9e0,(ulong)local_7a0);
  local_a80 = &local_a70;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a70 = *puVar13;
    lStack_a68 = plVar6[3];
  }
  else {
    local_a70 = *puVar13;
    local_a80 = (ulong *)*plVar6;
  }
  local_a78 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a80);
  local_aa0 = &local_a90;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a90 = *puVar13;
    lStack_a88 = plVar6[3];
  }
  else {
    local_a90 = *puVar13;
    local_aa0 = (ulong *)*plVar6;
  }
  local_a98 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_700 = &local_6f0;
  std::__cxx11::string::_M_construct((ulong)&local_700,'\x06');
  uVar12 = 0xf;
  if (local_aa0 != &local_a90) {
    uVar12 = local_a90;
  }
  if (uVar12 < (ulong)(local_6f8 + local_a98)) {
    uVar12 = 0xf;
    if (local_700 != &local_6f0) {
      uVar12 = local_6f0;
    }
    if (uVar12 < (ulong)(local_6f8 + local_a98)) goto LAB_001c9b81;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_700,0,(char *)0x0,(ulong)local_aa0);
  }
  else {
LAB_001c9b81:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_aa0,(ulong)local_700);
  }
  local_a60 = &local_a50;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_a50 = *plVar6;
    lStack_a48 = puVar7[3];
  }
  else {
    local_a50 = *plVar6;
    local_a60 = (long *)*puVar7;
  }
  local_a58 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a60);
  local_a40 = &local_a30;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a30 = *puVar13;
    lStack_a28 = plVar6[3];
  }
  else {
    local_a30 = *puVar13;
    local_a40 = (ulong *)*plVar6;
  }
  local_a38 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_740 = &local_730;
  std::__cxx11::string::_M_construct((ulong)&local_740,'\x06');
  uVar12 = 0xf;
  if (local_a40 != &local_a30) {
    uVar12 = local_a30;
  }
  if (uVar12 < (ulong)(local_738 + local_a38)) {
    uVar12 = 0xf;
    if (local_740 != &local_730) {
      uVar12 = local_730;
    }
    if (uVar12 < (ulong)(local_738 + local_a38)) goto LAB_001c9ce4;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_740,0,(char *)0x0,(ulong)local_a40);
  }
  else {
LAB_001c9ce4:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a40,(ulong)local_740);
  }
  local_ac0 = &local_ab0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_ab0 = *plVar6;
    lStack_aa8 = puVar7[3];
  }
  else {
    local_ab0 = *plVar6;
    local_ac0 = (long *)*puVar7;
  }
  local_ab8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_ac0);
  local_ae0 = &local_ad0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_ad0 = *puVar13;
    lStack_ac8 = plVar6[3];
  }
  else {
    local_ad0 = *puVar13;
    local_ae0 = (ulong *)*plVar6;
  }
  local_ad8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_720 = &local_710;
  std::__cxx11::string::_M_construct((ulong)&local_720,'\x06');
  uVar12 = 0xf;
  if (local_ae0 != &local_ad0) {
    uVar12 = local_ad0;
  }
  if (uVar12 < (ulong)(local_718 + local_ad8)) {
    uVar12 = 0xf;
    if (local_720 != &local_710) {
      uVar12 = local_710;
    }
    if (uVar12 < (ulong)(local_718 + local_ad8)) goto LAB_001c9e23;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_720,0,(char *)0x0,(ulong)local_ae0);
  }
  else {
LAB_001c9e23:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ae0,(ulong)local_720);
  }
  local_b00 = &local_af0;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_af0 = *puVar13;
    lStack_ae8 = puVar7[3];
  }
  else {
    local_af0 = *puVar13;
    local_b00 = (ulong *)*puVar7;
  }
  local_af8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b00);
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_940.field_2._M_allocated_capacity = *psVar10;
    local_940.field_2._8_8_ = plVar6[3];
  }
  else {
    local_940.field_2._M_allocated_capacity = *psVar10;
    local_940._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_940._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_6e0,(ulong)local_940._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p);
  }
  if (local_b00 != &local_af0) {
    operator_delete(local_b00);
  }
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if (local_ae0 != &local_ad0) {
    operator_delete(local_ae0);
  }
  if (local_ac0 != &local_ab0) {
    operator_delete(local_ac0);
  }
  if (local_740 != &local_730) {
    operator_delete(local_740);
  }
  if (local_a40 != &local_a30) {
    operator_delete(local_a40);
  }
  if (local_a60 != &local_a50) {
    operator_delete(local_a60);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if (local_aa0 != &local_a90) {
    operator_delete(local_aa0);
  }
  if (local_a80 != &local_a70) {
    operator_delete(local_a80);
  }
  if (local_9e0 != &local_9d0) {
    operator_delete(local_9e0);
  }
  if (local_9a0 != &local_990) {
    operator_delete(local_9a0);
  }
  if (local_8c0 != &local_8b0) {
    operator_delete(local_8c0);
  }
  if (local_a20 != &local_a10) {
    operator_delete(local_a20);
  }
  if (local_a00 != &local_9f0) {
    operator_delete(local_a00);
  }
  if (local_840 != &local_830) {
    operator_delete(local_840);
  }
  if (local_9c0 != &local_9b0) {
    operator_delete(local_9c0);
  }
  if (local_980 != &local_970) {
    operator_delete(local_980);
  }
  if (local_960 != &local_950) {
    operator_delete(local_960);
  }
  if (local_8e0 != &local_8d0) {
    operator_delete(local_8e0);
  }
  if (local_820 != &local_810) {
    operator_delete(local_820);
  }
  if (local_900 != &local_8f0) {
    operator_delete(local_900);
  }
  if (local_860 != &local_850) {
    operator_delete(local_860);
  }
  if (local_920 != &local_910) {
    operator_delete(local_920);
  }
  if (local_760 != &local_750) {
    operator_delete(local_760);
  }
  if (local_880 != &local_870) {
    operator_delete(local_880);
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0);
  }
  if (local_7e0 != &local_7d0) {
    operator_delete(local_7e0);
  }
  if (local_800 != &local_7f0) {
    operator_delete(local_800);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780);
  }
  genClusterInitialization(&local_940,this,&local_8a0);
  std::__cxx11::string::_M_append((char *)local_6e0,(ulong)local_940._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x06');
  plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_350 = *puVar13;
    lStack_348 = plVar6[3];
    local_360 = &local_350;
  }
  else {
    local_350 = *puVar13;
    local_360 = (ulong *)*plVar6;
  }
  local_358 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_380 = local_370;
  std::__cxx11::string::_M_construct((ulong)&local_380,'\x06');
  uVar12 = 0xf;
  if (local_360 != &local_350) {
    uVar12 = local_350;
  }
  if (uVar12 < (ulong)(local_378 + local_358)) {
    uVar12 = 0xf;
    if (local_380 != local_370) {
      uVar12 = local_370[0];
    }
    if (uVar12 < (ulong)(local_378 + local_358)) goto LAB_001ca332;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_380,0,(char *)0x0,(ulong)local_360);
  }
  else {
LAB_001ca332:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_380);
  }
  local_2c0 = &local_2b0;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_2b0 = *puVar1;
    uStack_2a8 = puVar7[3];
  }
  else {
    local_2b0 = *puVar1;
    local_2c0 = (undefined8 *)*puVar7;
  }
  local_2b8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_6c0 = &local_6b0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_6b0 = *puVar13;
    lStack_6a8 = plVar6[3];
  }
  else {
    local_6b0 = *puVar13;
    local_6c0 = (ulong *)*plVar6;
  }
  local_6b8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct((ulong)&local_3a0,'\t');
  uVar12 = 0xf;
  if (local_6c0 != &local_6b0) {
    uVar12 = local_6b0;
  }
  if (uVar12 < (ulong)(local_398 + local_6b8)) {
    uVar12 = 0xf;
    if (local_3a0 != local_390) {
      uVar12 = local_390[0];
    }
    if (uVar12 < (ulong)(local_398 + local_6b8)) goto LAB_001ca498;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,(ulong)local_6c0);
  }
  else {
LAB_001ca498:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6c0,(ulong)local_3a0);
  }
  local_2a0 = &local_290;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_290 = *puVar1;
    uStack_288 = puVar7[3];
  }
  else {
    local_290 = *puVar1;
    local_2a0 = (undefined8 *)*puVar7;
  }
  local_298 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a0);
  local_6a0 = &local_690;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_690 = *puVar13;
    lStack_688 = plVar6[3];
  }
  else {
    local_690 = *puVar13;
    local_6a0 = (ulong *)*plVar6;
  }
  local_698 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct((ulong)&local_3c0,'\t');
  uVar12 = 0xf;
  if (local_6a0 != &local_690) {
    uVar12 = local_690;
  }
  if (uVar12 < (ulong)(local_3b8 + local_698)) {
    uVar12 = 0xf;
    if (local_3c0 != local_3b0) {
      uVar12 = local_3b0[0];
    }
    if (uVar12 < (ulong)(local_3b8 + local_698)) goto LAB_001ca5fe;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,(ulong)local_6a0);
  }
  else {
LAB_001ca5fe:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6a0,(ulong)local_3c0);
  }
  local_280 = &local_270;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_270 = *puVar1;
    uStack_268 = puVar7[3];
  }
  else {
    local_270 = *puVar1;
    local_280 = (undefined8 *)*puVar7;
  }
  local_278 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_280);
  local_680 = &local_670;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_670 = *puVar13;
    lStack_668 = plVar6[3];
  }
  else {
    local_670 = *puVar13;
    local_680 = (ulong *)*plVar6;
  }
  local_678 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct((ulong)&local_3e0,'\t');
  uVar12 = 0xf;
  if (local_680 != &local_670) {
    uVar12 = local_670;
  }
  if (uVar12 < (ulong)(local_3d8 + local_678)) {
    uVar12 = 0xf;
    if (local_3e0 != local_3d0) {
      uVar12 = local_3d0[0];
    }
    if (uVar12 < (ulong)(local_3d8 + local_678)) goto LAB_001ca764;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3e0,0,(char *)0x0,(ulong)local_680);
  }
  else {
LAB_001ca764:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_680,(ulong)local_3e0);
  }
  local_260 = &local_250;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_250 = *puVar1;
    uStack_248 = puVar7[3];
  }
  else {
    local_250 = *puVar1;
    local_260 = (undefined8 *)*puVar7;
  }
  local_258 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_660 = &local_650;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_650 = *puVar13;
    lStack_648 = plVar6[3];
  }
  else {
    local_650 = *puVar13;
    local_660 = (ulong *)*plVar6;
  }
  local_658 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct((ulong)&local_400,'\f');
  uVar12 = 0xf;
  if (local_660 != &local_650) {
    uVar12 = local_650;
  }
  if (uVar12 < (ulong)(local_3f8 + local_658)) {
    uVar12 = 0xf;
    if (local_400 != local_3f0) {
      uVar12 = local_3f0[0];
    }
    if (uVar12 < (ulong)(local_3f8 + local_658)) goto LAB_001ca8ca;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,(ulong)local_660);
  }
  else {
LAB_001ca8ca:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_660,(ulong)local_400);
  }
  local_240 = &local_230;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_230 = *puVar1;
    uStack_228 = puVar7[3];
  }
  else {
    local_230 = *puVar1;
    local_240 = (undefined8 *)*puVar7;
  }
  local_238 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_240);
  local_640 = &local_630;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_630 = *puVar13;
    lStack_628 = plVar6[3];
  }
  else {
    local_630 = *puVar13;
    local_640 = (ulong *)*plVar6;
  }
  local_638 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_420 = local_410;
  std::__cxx11::string::_M_construct((ulong)&local_420,'\t');
  uVar12 = 0xf;
  if (local_640 != &local_630) {
    uVar12 = local_630;
  }
  if (uVar12 < (ulong)(local_418 + local_638)) {
    uVar12 = 0xf;
    if (local_420 != local_410) {
      uVar12 = local_410[0];
    }
    if (uVar12 < (ulong)(local_418 + local_638)) goto LAB_001caa30;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_420,0,(char *)0x0,(ulong)local_640);
  }
  else {
LAB_001caa30:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_640,(ulong)local_420);
  }
  local_220 = &local_210;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_210 = *puVar1;
    uStack_208 = puVar7[3];
  }
  else {
    local_210 = *puVar1;
    local_220 = (undefined8 *)*puVar7;
  }
  local_218 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_220);
  local_620 = &local_610;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_610 = *puVar13;
    lStack_608 = plVar6[3];
  }
  else {
    local_610 = *puVar13;
    local_620 = (ulong *)*plVar6;
  }
  local_618 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_440 = local_430;
  std::__cxx11::string::_M_construct((ulong)&local_440,'\t');
  uVar12 = 0xf;
  if (local_620 != &local_610) {
    uVar12 = local_610;
  }
  if (uVar12 < (ulong)(local_438 + local_618)) {
    uVar12 = 0xf;
    if (local_440 != local_430) {
      uVar12 = local_430[0];
    }
    if (uVar12 < (ulong)(local_438 + local_618)) goto LAB_001cab96;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,(ulong)local_620);
  }
  else {
LAB_001cab96:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_620,(ulong)local_440);
  }
  local_200 = &local_1f0;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_1f0 = *puVar1;
    uStack_1e8 = puVar7[3];
  }
  else {
    local_1f0 = *puVar1;
    local_200 = (undefined8 *)*puVar7;
  }
  local_1f8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_600 = &local_5f0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_5f0 = *puVar13;
    lStack_5e8 = plVar6[3];
  }
  else {
    local_5f0 = *puVar13;
    local_600 = (ulong *)*plVar6;
  }
  local_5f8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_460 = local_450;
  std::__cxx11::string::_M_construct((ulong)&local_460,'\t');
  uVar12 = 0xf;
  if (local_600 != &local_5f0) {
    uVar12 = local_5f0;
  }
  if (uVar12 < (ulong)(local_458 + local_5f8)) {
    uVar12 = 0xf;
    if (local_460 != local_450) {
      uVar12 = local_450[0];
    }
    if (uVar12 < (ulong)(local_458 + local_5f8)) goto LAB_001cacfc;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,(ulong)local_600);
  }
  else {
LAB_001cacfc:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_460);
  }
  local_1e0 = &local_1d0;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_1d0 = *puVar1;
    uStack_1c8 = puVar7[3];
  }
  else {
    local_1d0 = *puVar1;
    local_1e0 = (undefined8 *)*puVar7;
  }
  local_1d8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  local_5e0 = &local_5d0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_5d0 = *puVar13;
    lStack_5c8 = plVar6[3];
  }
  else {
    local_5d0 = *puVar13;
    local_5e0 = (ulong *)*plVar6;
  }
  local_5d8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_480 = local_470;
  std::__cxx11::string::_M_construct((ulong)&local_480,'\t');
  uVar12 = 0xf;
  if (local_5e0 != &local_5d0) {
    uVar12 = local_5d0;
  }
  if (uVar12 < (ulong)(local_478 + local_5d8)) {
    uVar12 = 0xf;
    if (local_480 != local_470) {
      uVar12 = local_470[0];
    }
    if (uVar12 < (ulong)(local_478 + local_5d8)) goto LAB_001cae62;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_480,0,(char *)0x0,(ulong)local_5e0);
  }
  else {
LAB_001cae62:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5e0,(ulong)local_480);
  }
  local_1c0 = &local_1b0;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_1b0 = *puVar1;
    uStack_1a8 = puVar7[3];
  }
  else {
    local_1b0 = *puVar1;
    local_1c0 = (undefined8 *)*puVar7;
  }
  local_1b8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  local_5c0 = &local_5b0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_5b0 = *puVar13;
    lStack_5a8 = plVar6[3];
  }
  else {
    local_5b0 = *puVar13;
    local_5c0 = (ulong *)*plVar6;
  }
  local_5b8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct((ulong)&local_4a0,'\f');
  uVar12 = 0xf;
  if (local_5c0 != &local_5b0) {
    uVar12 = local_5b0;
  }
  if (uVar12 < (ulong)(local_498 + local_5b8)) {
    uVar12 = 0xf;
    if (local_4a0 != local_490) {
      uVar12 = local_490[0];
    }
    if (uVar12 < (ulong)(local_498 + local_5b8)) goto LAB_001cafc8;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,(ulong)local_5c0);
  }
  else {
LAB_001cafc8:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c0,(ulong)local_4a0);
  }
  local_1a0 = &local_190;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_190 = *puVar1;
    uStack_188 = puVar7[3];
  }
  else {
    local_190 = *puVar1;
    local_1a0 = (undefined8 *)*puVar7;
  }
  local_198 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  local_5a0 = &local_590;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_590 = *puVar13;
    lStack_588 = plVar6[3];
  }
  else {
    local_590 = *puVar13;
    local_5a0 = (ulong *)*plVar6;
  }
  local_598 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_4c0 = local_4b0;
  std::__cxx11::string::_M_construct((ulong)&local_4c0,'\f');
  uVar12 = 0xf;
  if (local_5a0 != &local_590) {
    uVar12 = local_590;
  }
  if (uVar12 < (ulong)(local_4b8 + local_598)) {
    uVar12 = 0xf;
    if (local_4c0 != local_4b0) {
      uVar12 = local_4b0[0];
    }
    if (uVar12 < (ulong)(local_4b8 + local_598)) goto LAB_001cb12e;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4c0,0,(char *)0x0,(ulong)local_5a0);
  }
  else {
LAB_001cb12e:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5a0,(ulong)local_4c0);
  }
  local_180 = &local_170;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_170 = *puVar1;
    uStack_168 = puVar7[3];
  }
  else {
    local_170 = *puVar1;
    local_180 = (undefined8 *)*puVar7;
  }
  local_178 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_580 = &local_570;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_570 = *puVar13;
    lStack_568 = plVar6[3];
  }
  else {
    local_570 = *puVar13;
    local_580 = (ulong *)*plVar6;
  }
  local_578 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_4e0 = local_4d0;
  std::__cxx11::string::_M_construct((ulong)&local_4e0,'\f');
  uVar12 = 0xf;
  if (local_580 != &local_570) {
    uVar12 = local_570;
  }
  if (uVar12 < (ulong)(local_4d8 + local_578)) {
    uVar12 = 0xf;
    if (local_4e0 != local_4d0) {
      uVar12 = local_4d0[0];
    }
    if (uVar12 < (ulong)(local_4d8 + local_578)) goto LAB_001cb294;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4e0,0,(char *)0x0,(ulong)local_580);
  }
  else {
LAB_001cb294:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_580,(ulong)local_4e0);
  }
  local_160 = &local_150;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_150 = *puVar1;
    uStack_148 = puVar7[3];
  }
  else {
    local_150 = *puVar1;
    local_160 = (undefined8 *)*puVar7;
  }
  local_158 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_560 = &local_550;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_550 = *puVar13;
    lStack_548 = plVar6[3];
  }
  else {
    local_550 = *puVar13;
    local_560 = (ulong *)*plVar6;
  }
  local_558 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_500 = local_4f0;
  std::__cxx11::string::_M_construct((ulong)&local_500,'\f');
  uVar12 = 0xf;
  if (local_560 != &local_550) {
    uVar12 = local_550;
  }
  if (uVar12 < (ulong)(local_4f8 + local_558)) {
    uVar12 = 0xf;
    if (local_500 != local_4f0) {
      uVar12 = local_4f0[0];
    }
    if (uVar12 < (ulong)(local_4f8 + local_558)) goto LAB_001cb3fa;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_500,0,(char *)0x0,(ulong)local_560);
  }
  else {
LAB_001cb3fa:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_500);
  }
  local_140 = &local_130;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_130 = *puVar1;
    uStack_128 = puVar7[3];
  }
  else {
    local_130 = *puVar1;
    local_140 = (undefined8 *)*puVar7;
  }
  local_138 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
  local_720 = &local_710;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_710 = *puVar13;
    lStack_708 = plVar6[3];
  }
  else {
    local_710 = *puVar13;
    local_720 = (ulong *)*plVar6;
  }
  local_718 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_520 = local_510;
  std::__cxx11::string::_M_construct((ulong)&local_520,'\f');
  uVar12 = 0xf;
  if (local_720 != &local_710) {
    uVar12 = local_710;
  }
  if (uVar12 < (ulong)(local_518 + local_718)) {
    uVar12 = 0xf;
    if (local_520 != local_510) {
      uVar12 = local_510[0];
    }
    if (uVar12 < (ulong)(local_518 + local_718)) goto LAB_001cb564;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_520,0,(char *)0x0,(ulong)local_720);
  }
  else {
LAB_001cb564:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_720,(ulong)local_520);
  }
  local_740 = &local_730;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_730 = *puVar13;
    uStack_728 = puVar7[3];
  }
  else {
    local_730 = *puVar13;
    local_740 = (ulong *)*puVar7;
  }
  local_738 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_740);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_6f0 = *puVar13;
    lStack_6e8 = plVar6[3];
    local_700 = &local_6f0;
  }
  else {
    local_6f0 = *puVar13;
    local_700 = (ulong *)*plVar6;
  }
  local_6f8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_540 = local_530;
  std::__cxx11::string::_M_construct((ulong)&local_540,'\x0f');
  uVar12 = 0xf;
  if (local_700 != &local_6f0) {
    uVar12 = local_6f0;
  }
  if (uVar12 < (ulong)(local_538 + local_6f8)) {
    uVar12 = 0xf;
    if (local_540 != local_530) {
      uVar12 = local_530[0];
    }
    if (uVar12 < (ulong)(local_538 + local_6f8)) goto LAB_001cb6d2;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_540,0,(char *)0x0,(ulong)local_700);
  }
  else {
LAB_001cb6d2:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_700,(ulong)local_540);
  }
  local_8c0 = &local_8b0;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_8b0 = *puVar13;
    uStack_8a8 = puVar7[3];
  }
  else {
    local_8b0 = *puVar13;
    local_8c0 = (ulong *)*puVar7;
  }
  local_8b8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_8c0);
  local_840 = &local_830;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_830 = *puVar13;
    lStack_828 = plVar6[3];
  }
  else {
    local_830 = *puVar13;
    local_840 = (ulong *)*plVar6;
  }
  local_838 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_840,(ulong)local_8a0._M_dataplus._M_p);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_810 = *puVar13;
    lStack_808 = plVar6[3];
    local_820 = &local_810;
  }
  else {
    local_810 = *puVar13;
    local_820 = (ulong *)*plVar6;
  }
  local_818 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_820);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_750 = *puVar13;
    lStack_748 = plVar6[3];
    local_760 = &local_750;
  }
  else {
    local_750 = *puVar13;
    local_760 = (ulong *)*plVar6;
  }
  local_758 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_760);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_7d0 = *puVar13;
    lStack_7c8 = plVar6[3];
    local_7e0 = &local_7d0;
  }
  else {
    local_7d0 = *puVar13;
    local_7e0 = (ulong *)*plVar6;
  }
  local_7d8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct((ulong)&local_2e0,'\x0f');
  uVar12 = 0xf;
  if (local_7e0 != &local_7d0) {
    uVar12 = local_7d0;
  }
  if (uVar12 < (ulong)(local_2d8 + local_7d8)) {
    uVar12 = 0xf;
    if (local_2e0 != local_2d0) {
      uVar12 = local_2d0[0];
    }
    if (uVar12 < (ulong)(local_2d8 + local_7d8)) goto LAB_001cb961;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_7e0);
  }
  else {
LAB_001cb961:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7e0,(ulong)local_2e0);
  }
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_770 = *puVar13;
    uStack_768 = puVar7[3];
    local_780 = &local_770;
  }
  else {
    local_770 = *puVar13;
    local_780 = (ulong *)*puVar7;
  }
  local_778 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_780);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_7f0 = *puVar13;
    lStack_7e8 = plVar6[3];
    local_800 = &local_7f0;
  }
  else {
    local_7f0 = *puVar13;
    local_800 = (ulong *)*plVar6;
  }
  local_7f8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct((ulong)&local_300,'\x0f');
  uVar12 = 0xf;
  if (local_800 != &local_7f0) {
    uVar12 = local_7f0;
  }
  if (uVar12 < (ulong)(local_2f8 + local_7f8)) {
    uVar12 = 0xf;
    if (local_300 != local_2f0) {
      uVar12 = local_2f0[0];
    }
    if (uVar12 < (ulong)(local_2f8 + local_7f8)) goto LAB_001cbac9;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)local_800);
  }
  else {
LAB_001cbac9:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_800,(ulong)local_300);
  }
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_7b0 = *puVar1;
    uStack_7a8 = puVar7[3];
    local_7c0 = &local_7b0;
  }
  else {
    local_7b0 = *puVar1;
    local_7c0 = (undefined8 *)*puVar7;
  }
  local_7b8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_7c0);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_870 = *puVar13;
    lStack_868 = plVar6[3];
    local_880 = &local_870;
  }
  else {
    local_870 = *puVar13;
    local_880 = (ulong *)*plVar6;
  }
  local_878 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_320 = local_310;
  std::__cxx11::string::_M_construct((ulong)&local_320,'\x12');
  uVar12 = 0xf;
  if (local_880 != &local_870) {
    uVar12 = local_870;
  }
  if (uVar12 < (ulong)(local_318 + local_878)) {
    uVar12 = 0xf;
    if (local_320 != local_310) {
      uVar12 = local_310[0];
    }
    if (uVar12 < (ulong)(local_318 + local_878)) goto LAB_001cbc2a;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,(ulong)local_880);
  }
  else {
LAB_001cbc2a:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_880,(ulong)local_320);
  }
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_910 = *puVar1;
    uStack_908 = puVar7[3];
    local_920 = &local_910;
  }
  else {
    local_910 = *puVar1;
    local_920 = (undefined8 *)*puVar7;
  }
  local_918 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_920);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_850 = *puVar13;
    lStack_848 = plVar6[3];
    local_860 = &local_850;
  }
  else {
    local_850 = *puVar13;
    local_860 = (ulong *)*plVar6;
  }
  local_858 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_340 = local_330;
  std::__cxx11::string::_M_construct((ulong)&local_340,'\x12');
  uVar12 = 0xf;
  if (local_860 != &local_850) {
    uVar12 = local_850;
  }
  if (uVar12 < (ulong)(local_338 + local_858)) {
    uVar12 = 0xf;
    if (local_340 != local_330) {
      uVar12 = local_330[0];
    }
    if (uVar12 < (ulong)(local_338 + local_858)) goto LAB_001cbd81;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,(ulong)local_860);
  }
  else {
LAB_001cbd81:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_340);
  }
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_8f0 = *puVar13;
    lStack_8e8 = puVar7[3];
    local_900 = &local_8f0;
  }
  else {
    local_8f0 = *puVar13;
    local_900 = (ulong *)*puVar7;
  }
  local_8f8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_900);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_8d0 = *puVar13;
    lStack_8c8 = plVar6[3];
    local_8e0 = &local_8d0;
  }
  else {
    local_8d0 = *puVar13;
    local_8e0 = (ulong *)*plVar6;
  }
  local_8d8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,'\x0f');
  uVar12 = 0xf;
  if (local_8e0 != &local_8d0) {
    uVar12 = local_8d0;
  }
  if (uVar12 < (ulong)(local_78 + local_8d8)) {
    uVar12 = 0xf;
    if (local_80 != local_70) {
      uVar12 = local_70[0];
    }
    if (uVar12 < (ulong)(local_78 + local_8d8)) goto LAB_001cbed1;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_8e0);
  }
  else {
LAB_001cbed1:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8e0,(ulong)local_80);
  }
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_950 = *puVar13;
    lStack_948 = puVar7[3];
    local_960 = &local_950;
  }
  else {
    local_950 = *puVar13;
    local_960 = (ulong *)*puVar7;
  }
  local_958 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_960);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_970 = *puVar13;
    lStack_968 = plVar6[3];
    local_980 = &local_970;
  }
  else {
    local_970 = *puVar13;
    local_980 = (ulong *)*plVar6;
  }
  local_978 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,'\f');
  uVar12 = 0xf;
  if (local_980 != &local_970) {
    uVar12 = local_970;
  }
  if (uVar12 < (ulong)(local_98 + local_978)) {
    uVar12 = 0xf;
    if (local_a0 != local_90) {
      uVar12 = local_90[0];
    }
    if (uVar12 < (ulong)(local_98 + local_978)) goto LAB_001cc03a;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_980);
  }
  else {
LAB_001cc03a:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_980,(ulong)local_a0);
  }
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_9b0 = *puVar13;
    lStack_9a8 = puVar7[3];
    local_9c0 = &local_9b0;
  }
  else {
    local_9b0 = *puVar13;
    local_9c0 = (ulong *)*puVar7;
  }
  local_9b8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_9c0);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_9f0 = *puVar13;
    lStack_9e8 = plVar6[3];
    local_a00 = &local_9f0;
  }
  else {
    local_9f0 = *puVar13;
    local_a00 = (ulong *)*plVar6;
  }
  local_9f8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct((ulong)&local_c0,'\f');
  uVar12 = 0xf;
  if (local_a00 != &local_9f0) {
    uVar12 = local_9f0;
  }
  if (uVar12 < (ulong)(local_b8 + local_9f8)) {
    uVar12 = 0xf;
    if (local_c0 != local_b0) {
      uVar12 = local_b0[0];
    }
    if (uVar12 < (ulong)(local_b8 + local_9f8)) goto LAB_001cc193;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a00);
  }
  else {
LAB_001cc193:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a00,(ulong)local_c0);
  }
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_a10 = *puVar13;
    lStack_a08 = puVar7[3];
    local_a20 = &local_a10;
  }
  else {
    local_a10 = *puVar13;
    local_a20 = (ulong *)*puVar7;
  }
  local_a18 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a20);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_990 = *puVar13;
    lStack_988 = plVar6[3];
    local_9a0 = &local_990;
  }
  else {
    local_990 = *puVar13;
    local_9a0 = (ulong *)*plVar6;
  }
  local_998 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_9a0);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_9d0 = *puVar13;
    lStack_9c8 = plVar6[3];
    local_9e0 = &local_9d0;
  }
  else {
    local_9d0 = *puVar13;
    local_9e0 = (ulong *)*plVar6;
  }
  local_9d8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct((ulong)&local_e0,'\f');
  uVar12 = 0xf;
  if (local_9e0 != &local_9d0) {
    uVar12 = local_9d0;
  }
  if (uVar12 < (ulong)(local_d8 + local_9d8)) {
    uVar12 = 0xf;
    if (local_e0 != local_d0) {
      uVar12 = local_d0[0];
    }
    if (uVar12 < (ulong)(local_d8 + local_9d8)) goto LAB_001cc365;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_9e0);
  }
  else {
LAB_001cc365:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9e0,(ulong)local_e0);
  }
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_a70 = *puVar13;
    lStack_a68 = puVar7[3];
    local_a80 = &local_a70;
  }
  else {
    local_a70 = *puVar13;
    local_a80 = (ulong *)*puVar7;
  }
  local_a78 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a80);
  local_aa0 = &local_a90;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a90 = *puVar13;
    lStack_a88 = plVar6[3];
  }
  else {
    local_a90 = *puVar13;
    local_aa0 = (ulong *)*plVar6;
  }
  local_a98 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_100 = local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,'\f');
  uVar12 = 0xf;
  if (local_aa0 != &local_a90) {
    uVar12 = local_a90;
  }
  if (uVar12 < (ulong)(local_f8 + local_a98)) {
    uVar12 = 0xf;
    if (local_100 != local_f0) {
      uVar12 = local_f0[0];
    }
    if (uVar12 < (ulong)(local_f8 + local_a98)) goto LAB_001cc4ab;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_aa0);
  }
  else {
LAB_001cc4ab:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_aa0,(ulong)local_100);
  }
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_a50 = *plVar6;
    lStack_a48 = puVar7[3];
    local_a60 = &local_a50;
  }
  else {
    local_a50 = *plVar6;
    local_a60 = (long *)*puVar7;
  }
  local_a58 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a60);
  local_a40 = &local_a30;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a30 = *puVar13;
    lStack_a28 = plVar6[3];
  }
  else {
    local_a30 = *puVar13;
    local_a40 = (ulong *)*plVar6;
  }
  local_a38 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a40,(ulong)local_8a0._M_dataplus._M_p);
  local_ac0 = &local_ab0;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_ab0 = *plVar11;
    lStack_aa8 = plVar6[3];
  }
  else {
    local_ab0 = *plVar11;
    local_ac0 = (long *)*plVar6;
  }
  local_ab8 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_ac0);
  local_ae0 = &local_ad0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_ad0 = *puVar13;
    lStack_ac8 = plVar6[3];
  }
  else {
    local_ad0 = *puVar13;
    local_ae0 = (ulong *)*plVar6;
  }
  local_ad8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_120 = local_110;
  std::__cxx11::string::_M_construct((ulong)&local_120,'\t');
  uVar12 = 0xf;
  if (local_ae0 != &local_ad0) {
    uVar12 = local_ad0;
  }
  if (uVar12 < (ulong)(local_118 + local_ad8)) {
    uVar12 = 0xf;
    if (local_120 != local_110) {
      uVar12 = local_110[0];
    }
    if (uVar12 < (ulong)(local_118 + local_ad8)) goto LAB_001cc6b4;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_ae0);
  }
  else {
LAB_001cc6b4:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ae0,(ulong)local_120);
  }
  local_b00 = &local_af0;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_af0 = *puVar13;
    lStack_ae8 = puVar7[3];
  }
  else {
    local_af0 = *puVar13;
    local_b00 = (ulong *)*puVar7;
  }
  local_af8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b00);
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_940.field_2._M_allocated_capacity = *psVar10;
    local_940.field_2._8_8_ = plVar6[3];
  }
  else {
    local_940.field_2._M_allocated_capacity = *psVar10;
    local_940._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_940._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_6e0,(ulong)local_940._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p);
  }
  if (local_b00 != &local_af0) {
    operator_delete(local_b00);
  }
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  if (local_ae0 != &local_ad0) {
    operator_delete(local_ae0);
  }
  if (local_ac0 != &local_ab0) {
    operator_delete(local_ac0);
  }
  if (local_a40 != &local_a30) {
    operator_delete(local_a40);
  }
  if (local_a60 != &local_a50) {
    operator_delete(local_a60);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  if (local_aa0 != &local_a90) {
    operator_delete(local_aa0);
  }
  if (local_a80 != &local_a70) {
    operator_delete(local_a80);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  if (local_9e0 != &local_9d0) {
    operator_delete(local_9e0);
  }
  if (local_9a0 != &local_990) {
    operator_delete(local_9a0);
  }
  if (local_a20 != &local_a10) {
    operator_delete(local_a20);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  if (local_a00 != &local_9f0) {
    operator_delete(local_a00);
  }
  if (local_9c0 != &local_9b0) {
    operator_delete(local_9c0);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_980 != &local_970) {
    operator_delete(local_980);
  }
  if (local_960 != &local_950) {
    operator_delete(local_960);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_8e0 != &local_8d0) {
    operator_delete(local_8e0);
  }
  if (local_900 != &local_8f0) {
    operator_delete(local_900);
  }
  if (local_340 != local_330) {
    operator_delete(local_340);
  }
  if (local_860 != &local_850) {
    operator_delete(local_860);
  }
  if (local_920 != &local_910) {
    operator_delete(local_920);
  }
  if (local_320 != local_310) {
    operator_delete(local_320);
  }
  if (local_880 != &local_870) {
    operator_delete(local_880);
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if (local_800 != &local_7f0) {
    operator_delete(local_800);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780);
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_7e0 != &local_7d0) {
    operator_delete(local_7e0);
  }
  if (local_760 != &local_750) {
    operator_delete(local_760);
  }
  if (local_820 != &local_810) {
    operator_delete(local_820);
  }
  if (local_840 != &local_830) {
    operator_delete(local_840);
  }
  if (local_8c0 != &local_8b0) {
    operator_delete(local_8c0);
  }
  if (local_540 != local_530) {
    operator_delete(local_540);
  }
  if (local_700 != &local_6f0) {
    operator_delete(local_700);
  }
  if (local_740 != &local_730) {
    operator_delete(local_740);
  }
  if (local_520 != local_510) {
    operator_delete(local_520);
  }
  if (local_720 != &local_710) {
    operator_delete(local_720);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140);
  }
  if (local_500 != local_4f0) {
    operator_delete(local_500);
  }
  if (local_560 != &local_550) {
    operator_delete(local_560);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_580 != &local_570) {
    operator_delete(local_580);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  if (local_4c0 != local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  if (local_4a0 != local_490) {
    operator_delete(local_4a0);
  }
  if (local_5c0 != &local_5b0) {
    operator_delete(local_5c0);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_480 != local_470) {
    operator_delete(local_480);
  }
  if (local_5e0 != &local_5d0) {
    operator_delete(local_5e0);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_460 != local_450) {
    operator_delete(local_460);
  }
  if (local_600 != &local_5f0) {
    operator_delete(local_600);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if (local_440 != local_430) {
    operator_delete(local_440);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  if (local_420 != local_410) {
    operator_delete(local_420);
  }
  if (local_640 != &local_630) {
    operator_delete(local_640);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if (local_400 != local_3f0) {
    operator_delete(local_400);
  }
  if (local_660 != &local_650) {
    operator_delete(local_660);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_680 != &local_670) {
    operator_delete(local_680);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_6a0 != &local_690) {
    operator_delete(local_6a0);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if (local_6c0 != &local_6b0) {
    operator_delete(local_6c0);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_9a0 = &local_990;
  std::__cxx11::string::_M_construct((ulong)&local_9a0,'\t');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_9a0);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_9d0 = *puVar13;
    lStack_9c8 = plVar6[3];
    local_9e0 = &local_9d0;
  }
  else {
    local_9d0 = *puVar13;
    local_9e0 = (ulong *)*plVar6;
  }
  local_9d8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_a20 = &local_a10;
  std::__cxx11::string::_M_construct((ulong)&local_a20,'\t');
  uVar12 = 0xf;
  if (local_9e0 != &local_9d0) {
    uVar12 = local_9d0;
  }
  if (uVar12 < (ulong)(local_a18 + local_9d8)) {
    uVar12 = 0xf;
    if (local_a20 != &local_a10) {
      uVar12 = local_a10;
    }
    if (uVar12 < (ulong)(local_a18 + local_9d8)) goto LAB_001cd0b7;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a20,0,(char *)0x0,(ulong)local_9e0);
  }
  else {
LAB_001cd0b7:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9e0,(ulong)local_a20);
  }
  local_a80 = &local_a70;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_a70 = *puVar13;
    lStack_a68 = puVar7[3];
  }
  else {
    local_a70 = *puVar13;
    local_a80 = (ulong *)*puVar7;
  }
  local_a78 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a80);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a90 = *puVar13;
    lStack_a88 = plVar6[3];
    local_aa0 = &local_a90;
  }
  else {
    local_a90 = *puVar13;
    local_aa0 = (ulong *)*plVar6;
  }
  local_a98 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_a00 = &local_9f0;
  std::__cxx11::string::_M_construct((ulong)&local_a00,'\t');
  uVar12 = 0xf;
  if (local_aa0 != &local_a90) {
    uVar12 = local_a90;
  }
  if (uVar12 < (ulong)(local_9f8 + local_a98)) {
    uVar12 = 0xf;
    if (local_a00 != &local_9f0) {
      uVar12 = local_9f0;
    }
    if (uVar12 < (ulong)(local_9f8 + local_a98)) goto LAB_001cd200;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a00,0,(char *)0x0,(ulong)local_aa0);
  }
  else {
LAB_001cd200:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_aa0,(ulong)local_a00);
  }
  local_a60 = &local_a50;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_a50 = *plVar6;
    lStack_a48 = puVar7[3];
  }
  else {
    local_a50 = *plVar6;
    local_a60 = (long *)*puVar7;
  }
  local_a58 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a60);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a30 = *puVar13;
    lStack_a28 = plVar6[3];
    local_a40 = &local_a30;
  }
  else {
    local_a30 = *puVar13;
    local_a40 = (ulong *)*plVar6;
  }
  local_a38 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_9c0 = &local_9b0;
  std::__cxx11::string::_M_construct((ulong)&local_9c0,'\f');
  uVar12 = 0xf;
  if (local_a40 != &local_a30) {
    uVar12 = local_a30;
  }
  if (uVar12 < (ulong)(local_9b8 + local_a38)) {
    uVar12 = 0xf;
    if (local_9c0 != &local_9b0) {
      uVar12 = local_9b0;
    }
    if (uVar12 < (ulong)(local_9b8 + local_a38)) goto LAB_001cd34a;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9c0,0,(char *)0x0,(ulong)local_a40);
  }
  else {
LAB_001cd34a:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a40,(ulong)local_9c0);
  }
  local_ac0 = &local_ab0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_ab0 = *plVar6;
    lStack_aa8 = puVar7[3];
  }
  else {
    local_ab0 = *plVar6;
    local_ac0 = (long *)*puVar7;
  }
  local_ab8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_ac0);
  local_ae0 = &local_ad0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_ad0 = *puVar13;
    lStack_ac8 = plVar6[3];
  }
  else {
    local_ad0 = *puVar13;
    local_ae0 = (ulong *)*plVar6;
  }
  local_ad8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_980 = &local_970;
  std::__cxx11::string::_M_construct((ulong)&local_980,'\x0f');
  uVar12 = 0xf;
  if (local_ae0 != &local_ad0) {
    uVar12 = local_ad0;
  }
  paVar2 = &local_940.field_2;
  if (uVar12 < (ulong)(local_978 + local_ad8)) {
    uVar12 = 0xf;
    if (local_980 != &local_970) {
      uVar12 = local_970;
    }
    if (uVar12 < (ulong)(local_978 + local_ad8)) goto LAB_001cd482;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_980,0,(char *)0x0,(ulong)local_ae0);
  }
  else {
LAB_001cd482:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_ae0,(ulong)local_980);
  }
  local_b00 = &local_af0;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_af0 = *puVar13;
    lStack_ae8 = puVar7[3];
  }
  else {
    local_af0 = *puVar13;
    local_b00 = (ulong *)*puVar7;
  }
  local_af8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b00);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_940.field_2._M_allocated_capacity = *psVar10;
    local_940.field_2._8_8_ = plVar6[3];
    local_940._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_940.field_2._M_allocated_capacity = *psVar10;
    local_940._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_940._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_6e0,(ulong)local_940._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != paVar2) {
    operator_delete(local_940._M_dataplus._M_p);
  }
  if (local_b00 != &local_af0) {
    operator_delete(local_b00);
  }
  if (local_980 != &local_970) {
    operator_delete(local_980);
  }
  if (local_ae0 != &local_ad0) {
    operator_delete(local_ae0);
  }
  if (local_ac0 != &local_ab0) {
    operator_delete(local_ac0);
  }
  if (local_9c0 != &local_9b0) {
    operator_delete(local_9c0);
  }
  if (local_a40 != &local_a30) {
    operator_delete(local_a40);
  }
  if (local_a60 != &local_a50) {
    operator_delete(local_a60);
  }
  if (local_a00 != &local_9f0) {
    operator_delete(local_a00);
  }
  if (local_aa0 != &local_a90) {
    operator_delete(local_aa0);
  }
  if (local_a80 != &local_a70) {
    operator_delete(local_a80);
  }
  if (local_a20 != &local_a10) {
    operator_delete(local_a20);
  }
  if (local_9e0 != &local_9d0) {
    operator_delete(local_9e0);
  }
  if (local_9a0 != &local_990) {
    operator_delete(local_9a0);
  }
  local_940._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>();
  local_8e0 = (ulong *)0x0;
  do {
    if (((local_58->_fVars).super__Base_bitset<2UL>._M_w[(ulong)local_8e0 >> 6] >>
         ((ulong)local_8e0 & 0x3f) & 1) != 0) {
      pAVar8 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          (size_t)local_8e0);
      if (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w
           [(ulong)local_8e0 >> 6] >> ((ulong)local_8e0 & 0x3f) & 1) == 0) {
        local_a80 = &local_a70;
        std::__cxx11::string::_M_construct((ulong)&local_a80,'\f');
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_a80);
        local_aa0 = &local_a90;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_a90 = *puVar13;
          lStack_a88 = puVar7[3];
        }
        else {
          local_a90 = *puVar13;
          local_aa0 = (ulong *)*puVar7;
        }
        local_a98 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_aa0,(ulong)(pAVar8->_name)._M_dataplus._M_p);
        local_a60 = &local_a50;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_a50 = *plVar6;
          lStack_a48 = puVar7[3];
        }
        else {
          local_a50 = *plVar6;
          local_a60 = (long *)*puVar7;
        }
        local_a58 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_a60);
        local_a40 = &local_a30;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_a30 = *puVar13;
          lStack_a28 = puVar7[3];
        }
        else {
          local_a30 = *puVar13;
          local_a40 = (ulong *)*puVar7;
        }
        local_a38 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_a40);
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_ab0 = *plVar6;
          lStack_aa8 = puVar7[3];
          local_ac0 = &local_ab0;
        }
        else {
          local_ab0 = *plVar6;
          local_ac0 = (long *)*puVar7;
        }
        local_ab8 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_ac0,(ulong)(pAVar8->_name)._M_dataplus._M_p);
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_ad0 = *puVar13;
          lStack_ac8 = puVar7[3];
          local_ae0 = &local_ad0;
        }
        else {
          local_ad0 = *puVar13;
          local_ae0 = (ulong *)*puVar7;
        }
        local_ad8 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_ae0);
        local_b00 = &local_af0;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_af0 = *puVar13;
          lStack_ae8 = puVar7[3];
        }
        else {
          local_af0 = *puVar13;
          local_b00 = (ulong *)*puVar7;
        }
        local_af8 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_6e0,(ulong)local_b00);
        if (local_b00 != &local_af0) {
          operator_delete(local_b00);
        }
        if (local_ae0 != &local_ad0) {
          operator_delete(local_ae0);
        }
        if (local_ac0 != &local_ab0) {
          operator_delete(local_ac0);
        }
        if (local_a40 != &local_a30) {
          operator_delete(local_a40);
        }
        if (local_a60 != &local_a50) {
          operator_delete(local_a60);
        }
        if (local_aa0 != &local_a90) {
          operator_delete(local_aa0);
        }
        puVar13 = local_a80;
        if (local_a80 == &local_a70) goto LAB_001ce1e0;
      }
      else {
        pmVar9 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&clusterToVariableMap,(key_type *)&local_8e0);
        uVar12 = **(ulong **)
                   &((*(this->varToQuery[*pmVar9]->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ;
        cVar14 = '\x01';
        if (9 < uVar12) {
          uVar35 = uVar12;
          cVar27 = '\x04';
          do {
            cVar14 = cVar27;
            if (uVar35 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_001cdacf;
            }
            if (uVar35 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_001cdacf;
            }
            if (uVar35 < 10000) goto LAB_001cdacf;
            bVar3 = 99999 < uVar35;
            uVar35 = uVar35 / 10000;
            cVar27 = cVar14 + '\x04';
          } while (bVar3);
          cVar14 = cVar14 + '\x01';
        }
LAB_001cdacf:
        local_ae0 = &local_ad0;
        std::__cxx11::string::_M_construct((ulong)&local_ae0,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_ae0,(uint)local_ad8,uVar12);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_ae0,0,(char *)0x0,0x2a8219);
        local_b00 = &local_af0;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_af0 = *puVar13;
          lStack_ae8 = puVar7[3];
        }
        else {
          local_af0 = *puVar13;
          local_b00 = (ulong *)*puVar7;
        }
        local_af8 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        if (local_ae0 != &local_ad0) {
          operator_delete(local_ae0);
        }
        local_980 = &local_970;
        std::__cxx11::string::_M_construct((ulong)&local_980,'\f');
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_980);
        local_9c0 = &local_9b0;
        puVar13 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar13) {
          local_9b0 = *puVar13;
          lStack_9a8 = plVar6[3];
        }
        else {
          local_9b0 = *puVar13;
          local_9c0 = (ulong *)*plVar6;
        }
        local_9b8 = plVar6[1];
        *plVar6 = (long)puVar13;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9c0,(ulong)local_b00);
        local_a00 = &local_9f0;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_9f0 = *puVar13;
          lStack_9e8 = puVar7[3];
        }
        else {
          local_9f0 = *puVar13;
          local_a00 = (ulong *)*puVar7;
        }
        local_9f8 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a00);
        local_a20 = &local_a10;
        puVar13 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar13) {
          local_a10 = *puVar13;
          lStack_a08 = plVar6[3];
        }
        else {
          local_a10 = *puVar13;
          local_a20 = (ulong *)*plVar6;
        }
        local_a18 = plVar6[1];
        *plVar6 = (long)puVar13;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        local_960 = &local_950;
        std::__cxx11::string::_M_construct((ulong)&local_960,'\x12');
        uVar12 = 0xf;
        if (local_a20 != &local_a10) {
          uVar12 = local_a10;
        }
        if (uVar12 < (ulong)(local_958 + local_a18)) {
          uVar12 = 0xf;
          if (local_960 != &local_950) {
            uVar12 = local_950;
          }
          if (uVar12 < (ulong)(local_958 + local_a18)) goto LAB_001cdd4a;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_960,0,(char *)0x0,(ulong)local_a20);
        }
        else {
LAB_001cdd4a:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_a20,(ulong)local_960);
        }
        local_9a0 = &local_990;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_990 = *puVar13;
          lStack_988 = puVar7[3];
        }
        else {
          local_990 = *puVar13;
          local_9a0 = (ulong *)*puVar7;
        }
        local_998 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_9a0);
        local_9e0 = &local_9d0;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_9d0 = *puVar13;
          lStack_9c8 = puVar7[3];
        }
        else {
          local_9d0 = *puVar13;
          local_9e0 = (ulong *)*puVar7;
        }
        local_9d8 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_9e0,(ulong)(pAVar8->_name)._M_dataplus._M_p);
        local_a80 = &local_a70;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_a70 = *puVar13;
          lStack_a68 = puVar7[3];
        }
        else {
          local_a70 = *puVar13;
          local_a80 = (ulong *)*puVar7;
        }
        local_a78 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_a80);
        local_aa0 = &local_a90;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_a90 = *puVar13;
          lStack_a88 = puVar7[3];
        }
        else {
          local_a90 = *puVar13;
          local_aa0 = (ulong *)*puVar7;
        }
        local_a98 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_aa0);
        local_a60 = &local_a50;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_a50 = *plVar6;
          lStack_a48 = puVar7[3];
        }
        else {
          local_a50 = *plVar6;
          local_a60 = (long *)*puVar7;
        }
        local_a58 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_a60,(ulong)(pAVar8->_name)._M_dataplus._M_p);
        local_a40 = &local_a30;
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_a30 = *puVar13;
          lStack_a28 = puVar7[3];
        }
        else {
          local_a30 = *puVar13;
          local_a40 = (ulong *)*puVar7;
        }
        local_a38 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_a40);
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_ab0 = *plVar6;
          lStack_aa8 = puVar7[3];
          local_ac0 = &local_ab0;
        }
        else {
          local_ab0 = *plVar6;
          local_ac0 = (long *)*puVar7;
        }
        local_ab8 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_ac0);
        puVar13 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar13) {
          local_ad0 = *puVar13;
          lStack_ac8 = puVar7[3];
          local_ae0 = &local_ad0;
        }
        else {
          local_ad0 = *puVar13;
          local_ae0 = (ulong *)*puVar7;
        }
        local_ad8 = puVar7[1];
        *puVar7 = puVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_940,(ulong)local_ae0);
        if (local_ae0 != &local_ad0) {
          operator_delete(local_ae0);
        }
        if (local_ac0 != &local_ab0) {
          operator_delete(local_ac0);
        }
        if (local_a40 != &local_a30) {
          operator_delete(local_a40);
        }
        if (local_a60 != &local_a50) {
          operator_delete(local_a60);
        }
        if (local_aa0 != &local_a90) {
          operator_delete(local_aa0);
        }
        if (local_a80 != &local_a70) {
          operator_delete(local_a80);
        }
        if (local_9e0 != &local_9d0) {
          operator_delete(local_9e0);
        }
        if (local_9a0 != &local_990) {
          operator_delete(local_9a0);
        }
        if (local_960 != &local_950) {
          operator_delete(local_960);
        }
        if (local_a20 != &local_a10) {
          operator_delete(local_a20);
        }
        if (local_a00 != &local_9f0) {
          operator_delete(local_a00);
        }
        if (local_9c0 != &local_9b0) {
          operator_delete(local_9c0);
        }
        if (local_980 != &local_970) {
          operator_delete(local_980);
        }
        puVar13 = local_b00;
        if (local_b00 == &local_af0) goto LAB_001ce1e0;
      }
      operator_delete(puVar13);
    }
LAB_001ce1e0:
    local_8e0 = (ulong *)((long)local_8e0 + 1);
  } while (local_8e0 < (ulong *)0x64);
  local_ac0 = &local_ab0;
  std::__cxx11::string::_M_construct((ulong)&local_ac0,'\t');
  plVar6 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_ac0,0,(char *)0x0,(ulong)local_940._M_dataplus._M_p);
  local_ae0 = &local_ad0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_ad0 = *puVar13;
    lStack_ac8 = plVar6[3];
  }
  else {
    local_ad0 = *puVar13;
    local_ae0 = (ulong *)*plVar6;
  }
  local_ad8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_ae0);
  local_b00 = &local_af0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_af0 = *puVar13;
    lStack_ae8 = plVar6[3];
  }
  else {
    local_af0 = *puVar13;
    local_b00 = (ulong *)*plVar6;
  }
  local_af8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_6e0,(ulong)local_b00);
  if (local_b00 != &local_af0) {
    operator_delete(local_b00);
  }
  if (local_ae0 != &local_ad0) {
    operator_delete(local_ae0);
  }
  if (local_ac0 != &local_ab0) {
    operator_delete(local_ac0);
  }
  local_7c0 = &local_7b0;
  std::__cxx11::string::_M_construct((ulong)&local_7c0,'\t');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_7c0);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_870 = *puVar13;
    lStack_868 = plVar6[3];
    local_880 = &local_870;
  }
  else {
    local_870 = *puVar13;
    local_880 = (ulong *)*plVar6;
  }
  local_878 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_800 = &local_7f0;
  std::__cxx11::string::_M_construct((ulong)&local_800,'\x06');
  uVar12 = 0xf;
  if (local_880 != &local_870) {
    uVar12 = local_870;
  }
  if (uVar12 < (ulong)(local_7f8 + local_878)) {
    uVar12 = 0xf;
    if (local_800 != &local_7f0) {
      uVar12 = local_7f0;
    }
    if (uVar12 < (ulong)(local_7f8 + local_878)) goto LAB_001ce445;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_800,0,(char *)0x0,(ulong)local_880);
  }
  else {
LAB_001ce445:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_880,(ulong)local_800);
  }
  local_920 = &local_910;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_910 = *puVar1;
    uStack_908 = puVar7[3];
  }
  else {
    local_910 = *puVar1;
    local_920 = (undefined8 *)*puVar7;
  }
  local_918 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_920);
  local_860 = &local_850;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_850 = *puVar13;
    lStack_848 = plVar6[3];
  }
  else {
    local_850 = *puVar13;
    local_860 = (ulong *)*plVar6;
  }
  local_858 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_780 = &local_770;
  std::__cxx11::string::_M_construct((ulong)&local_780,'\x06');
  uVar12 = 0xf;
  if (local_860 != &local_850) {
    uVar12 = local_850;
  }
  if (uVar12 < (ulong)(local_778 + local_858)) {
    uVar12 = 0xf;
    if (local_780 != &local_770) {
      uVar12 = local_770;
    }
    if (uVar12 < (ulong)(local_778 + local_858)) goto LAB_001ce5a2;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_780,0,(char *)0x0,(ulong)local_860);
  }
  else {
LAB_001ce5a2:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_860,(ulong)local_780);
  }
  local_900 = &local_8f0;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_8f0 = *puVar13;
    lStack_8e8 = puVar7[3];
  }
  else {
    local_8f0 = *puVar13;
    local_900 = (ulong *)*puVar7;
  }
  local_8f8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_900);
  local_8e0 = &local_8d0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_8d0 = *puVar13;
    lStack_8c8 = plVar6[3];
  }
  else {
    local_8d0 = *puVar13;
    local_8e0 = (ulong *)*plVar6;
  }
  local_8d8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_8e0);
  local_960 = &local_950;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_950 = *puVar13;
    lStack_948 = plVar6[3];
  }
  else {
    local_950 = *puVar13;
    local_960 = (ulong *)*plVar6;
  }
  local_958 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_7e0 = &local_7d0;
  std::__cxx11::string::_M_construct((ulong)&local_7e0,'\x06');
  uVar12 = 0xf;
  if (local_960 != &local_950) {
    uVar12 = local_950;
  }
  if (uVar12 < (ulong)(local_7d8 + local_958)) {
    uVar12 = 0xf;
    if (local_7e0 != &local_7d0) {
      uVar12 = local_7d0;
    }
    if (uVar12 < (ulong)(local_7d8 + local_958)) goto LAB_001ce766;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_7e0,0,(char *)0x0,(ulong)local_960);
  }
  else {
LAB_001ce766:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_960,(ulong)local_7e0);
  }
  local_980 = &local_970;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_970 = *puVar13;
    lStack_968 = puVar7[3];
  }
  else {
    local_970 = *puVar13;
    local_980 = (ulong *)*puVar7;
  }
  local_978 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_980);
  local_9c0 = &local_9b0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_9b0 = *puVar13;
    lStack_9a8 = plVar6[3];
  }
  else {
    local_9b0 = *puVar13;
    local_9c0 = (ulong *)*plVar6;
  }
  local_9b8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_9c0);
  local_a00 = &local_9f0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_9f0 = *puVar13;
    lStack_9e8 = plVar6[3];
  }
  else {
    local_9f0 = *puVar13;
    local_a00 = (ulong *)*plVar6;
  }
  local_9f8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_760 = &local_750;
  std::__cxx11::string::_M_construct((ulong)&local_760,'\x06');
  uVar12 = 0xf;
  if (local_a00 != &local_9f0) {
    uVar12 = local_9f0;
  }
  if (uVar12 < (ulong)(local_758 + local_9f8)) {
    uVar12 = 0xf;
    if (local_760 != &local_750) {
      uVar12 = local_750;
    }
    if (uVar12 < (ulong)(local_758 + local_9f8)) goto LAB_001ce92a;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_760,0,(char *)0x0,(ulong)local_a00);
  }
  else {
LAB_001ce92a:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a00,(ulong)local_760);
  }
  local_a20 = &local_a10;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_a10 = *puVar13;
    lStack_a08 = puVar7[3];
  }
  else {
    local_a10 = *puVar13;
    local_a20 = (ulong *)*puVar7;
  }
  local_a18 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a20);
  local_9a0 = &local_990;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_990 = *puVar13;
    lStack_988 = plVar6[3];
  }
  else {
    local_990 = *puVar13;
    local_9a0 = (ulong *)*plVar6;
  }
  local_998 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_820 = &local_810;
  std::__cxx11::string::_M_construct((ulong)&local_820,'\x06');
  uVar12 = 0xf;
  if (local_9a0 != &local_990) {
    uVar12 = local_990;
  }
  if (uVar12 < (ulong)(local_818 + local_998)) {
    uVar12 = 0xf;
    if (local_820 != &local_810) {
      uVar12 = local_810;
    }
    if (uVar12 < (ulong)(local_818 + local_998)) goto LAB_001cea97;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_820,0,(char *)0x0,(ulong)local_9a0);
  }
  else {
LAB_001cea97:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9a0,(ulong)local_820);
  }
  local_9e0 = &local_9d0;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_9d0 = *puVar13;
    lStack_9c8 = puVar7[3];
  }
  else {
    local_9d0 = *puVar13;
    local_9e0 = (ulong *)*puVar7;
  }
  local_9d8 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_9e0);
  local_a80 = &local_a70;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a70 = *puVar13;
    lStack_a68 = plVar6[3];
  }
  else {
    local_a70 = *puVar13;
    local_a80 = (ulong *)*plVar6;
  }
  local_a78 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_840 = &local_830;
  std::__cxx11::string::_M_construct((ulong)&local_840,'\x06');
  uVar12 = 0xf;
  if (local_a80 != &local_a70) {
    uVar12 = local_a70;
  }
  if (uVar12 < (ulong)(local_838 + local_a78)) {
    uVar12 = 0xf;
    if (local_840 != &local_830) {
      uVar12 = local_830;
    }
    if (uVar12 < (ulong)(local_838 + local_a78)) goto LAB_001cec04;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_840,0,(char *)0x0,(ulong)local_a80);
  }
  else {
LAB_001cec04:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a80,(ulong)local_840);
  }
  local_aa0 = &local_a90;
  puVar13 = puVar7 + 2;
  if ((ulong *)*puVar7 == puVar13) {
    local_a90 = *puVar13;
    lStack_a88 = puVar7[3];
  }
  else {
    local_a90 = *puVar13;
    local_aa0 = (ulong *)*puVar7;
  }
  local_a98 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_aa0);
  local_a60 = &local_a50;
  plVar11 = plVar6 + 2;
  if ((long *)*plVar6 == plVar11) {
    local_a50 = *plVar11;
    lStack_a48 = plVar6[3];
  }
  else {
    local_a50 = *plVar11;
    local_a60 = (long *)*plVar6;
  }
  local_a58 = plVar6[1];
  *plVar6 = (long)plVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a60);
  local_a40 = &local_a30;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_a30 = *puVar13;
    lStack_a28 = plVar6[3];
  }
  else {
    local_a30 = *puVar13;
    local_a40 = (ulong *)*plVar6;
  }
  local_a38 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_8c0 = &local_8b0;
  std::__cxx11::string::_M_construct((ulong)&local_8c0,'\x06');
  uVar12 = 0xf;
  if (local_a40 != &local_a30) {
    uVar12 = local_a30;
  }
  if (uVar12 < (ulong)(local_8b8 + local_a38)) {
    uVar12 = 0xf;
    if (local_8c0 != &local_8b0) {
      uVar12 = local_8b0;
    }
    if ((ulong)(local_8b8 + local_a38) <= uVar12) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_8c0,0,(char *)0x0,(ulong)local_a40);
      goto LAB_001cedee;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a40,(ulong)local_8c0);
LAB_001cedee:
  local_ac0 = &local_ab0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_ab0 = *plVar6;
    lStack_aa8 = puVar7[3];
  }
  else {
    local_ab0 = *plVar6;
    local_ac0 = (long *)*puVar7;
  }
  local_ab8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_ac0);
  local_ae0 = &local_ad0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_ad0 = *puVar13;
    lStack_ac8 = plVar6[3];
  }
  else {
    local_ad0 = *puVar13;
    local_ae0 = (ulong *)*plVar6;
  }
  local_ad8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_ae0);
  local_b00 = &local_af0;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_af0 = *puVar13;
    lStack_ae8 = plVar6[3];
  }
  else {
    local_af0 = *puVar13;
    local_b00 = (ulong *)*plVar6;
  }
  local_af8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_6e0,(ulong)local_b00);
  if (local_b00 != &local_af0) {
    operator_delete(local_b00);
  }
  if (local_ae0 != &local_ad0) {
    operator_delete(local_ae0);
  }
  if (local_ac0 != &local_ab0) {
    operator_delete(local_ac0);
  }
  if (local_8c0 != &local_8b0) {
    operator_delete(local_8c0);
  }
  if (local_a40 != &local_a30) {
    operator_delete(local_a40);
  }
  if (local_a60 != &local_a50) {
    operator_delete(local_a60);
  }
  if (local_aa0 != &local_a90) {
    operator_delete(local_aa0);
  }
  if (local_840 != &local_830) {
    operator_delete(local_840);
  }
  if (local_a80 != &local_a70) {
    operator_delete(local_a80);
  }
  if (local_9e0 != &local_9d0) {
    operator_delete(local_9e0);
  }
  if (local_820 != &local_810) {
    operator_delete(local_820);
  }
  if (local_9a0 != &local_990) {
    operator_delete(local_9a0);
  }
  if (local_a20 != &local_a10) {
    operator_delete(local_a20);
  }
  if (local_760 != &local_750) {
    operator_delete(local_760);
  }
  psVar5 = local_60;
  if (local_a00 != &local_9f0) {
    operator_delete(local_a00);
  }
  if (local_9c0 != &local_9b0) {
    operator_delete(local_9c0);
  }
  if (local_980 != &local_970) {
    operator_delete(local_980);
  }
  if (local_7e0 != &local_7d0) {
    operator_delete(local_7e0);
  }
  if (local_960 != &local_950) {
    operator_delete(local_960);
  }
  if (local_8e0 != &local_8d0) {
    operator_delete(local_8e0);
  }
  if (local_900 != &local_8f0) {
    operator_delete(local_900);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780);
  }
  if (local_860 != &local_850) {
    operator_delete(local_860);
  }
  if (local_920 != &local_910) {
    operator_delete(local_920);
  }
  if (local_800 != &local_7f0) {
    operator_delete(local_800);
  }
  if (local_880 != &local_870) {
    operator_delete(local_880);
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0);
  }
  local_ae0 = &local_ad0;
  std::__cxx11::string::_M_construct((ulong)&local_ae0,'\x06');
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_ae0);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_af0 = *puVar13;
    lStack_ae8 = plVar6[3];
    local_b00 = &local_af0;
  }
  else {
    local_af0 = *puVar13;
    local_b00 = (ulong *)*plVar6;
  }
  local_af8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_6e0,(ulong)local_b00);
  if (local_b00 != &local_af0) {
    operator_delete(local_b00);
  }
  if (local_ae0 != &local_ad0) {
    operator_delete(local_ae0);
  }
  local_ae0 = &local_ad0;
  std::__cxx11::string::_M_construct((ulong)&local_ae0,'\x03');
  plVar6 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_ae0,0,(char *)0x0,(ulong)local_6e0[0]);
  puVar13 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar13) {
    local_af0 = *puVar13;
    lStack_ae8 = plVar6[3];
    local_b00 = &local_af0;
  }
  else {
    local_af0 = *puVar13;
    local_b00 = (ulong *)*plVar6;
  }
  local_af8 = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b00);
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    lVar4 = plVar6[3];
    (psVar5->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&psVar5->field_2 + 8) = lVar4;
  }
  else {
    (psVar5->_M_dataplus)._M_p = (pointer)*plVar6;
    (psVar5->field_2)._M_allocated_capacity = *psVar10;
  }
  psVar5->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_b00 != &local_af0) {
    operator_delete(local_b00);
  }
  if (local_ae0 != &local_ad0) {
    operator_delete(local_ae0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p);
  }
  if (local_6e0[0] != local_6d0) {
    operator_delete(local_6e0[0]);
  }
  if (local_7a0 != local_790) {
    operator_delete(local_7a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p);
  }
  return psVar5;
}

Assistant:

std::string KMeans::genKMeansFunction()
{
    // Get view for grid query -- equivalent to count query
    const size_t& gridViewID = countQuery->_aggregates[0]->_incoming[0].first;
    std::string gridViewName = "V"+std::to_string(gridViewID);
    View* gridView = _compiler->getView(gridViewID);

    const std::string numCategVar = std::to_string(_isCategoricalFeature.count()/2); 

    std::string returnString = "\n";

    // KMeans Function
    returnString += offset(1)+"void kMeans()\n"+offset(1)+"{\n"+
        offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n"+
        offset(2)+"const size_t grid_size = "+gridViewName+".size();\n"+
        offset(2)+"size_t best_cluster, iteration = 0;\n\n"+
        offset(2)+"double dist, min_dist, distance_to_mean["+numCategVar+" * k * k];\n"+
        offset(2)+"std::vector<size_t> assignments(grid_size,0);\n"+
        offset(2)+"bool clustersChanged = true;\n\n"+
        offset(2)+"Cluster_mean means[k] = {}, cluster_sums[k] = {};\n\n";

    // if (_isCategoricalFeature.any())
    //     returnString += offset(2)+"onehotEncodeCategVars();\n\n";
    // returnString += offset(2)+"// Initialize the means\n"+
    //     offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
    //     offset(3)+"means[cluster] = "+gridViewName+"[rand() % "+
    //     gridViewName+".size()];\n\n";

    // Code that initializes the clusters
    returnString += genClusterInitialization(gridViewName);

    // If we are gcc, we can use openmp to paralellize the computation do loop
    // for KMeans
#if USE_OMP 

    size_t nthreads = std::thread::hardware_concurrency();
    std::string nthreadString = std::to_string(nthreads);
    
    // Open do loop
    returnString += offset(2)+"Cluster_mean localClusterSums[k*"+
        nthreadString+"] = {};\n"+
        offset(2)+"bool localClustersChanged["+nthreadString+"];\n\n"+
        offset(2)+"do\n"+offset(2)+"{\n"+
        offset(3)+"clustersChanged = false;\n"+
        offset(3)+"// Reset the cluster sums to default values \n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(4)+"cluster_sums[cluster].reset();\n\n"+
        offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n\n"+
        offset(3)+"#pragma omp parallel num_threads("+nthreadString+") "+
        "private(min_dist,dist,best_cluster)\n"+
        offset(3)+"{\n"+
        offset(4)+"size_t thread_num = omp_get_thread_num();\n"+
        offset(4)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(4)+"localClusterSums[k*thread_num+cluster].reset();\n"+
        offset(4)+"localClustersChanged[thread_num] = false;\n\n"+
        offset(4)+"// iterate over grid points and find best cluster for each tuple\n"+
        offset(4)+"#pragma omp for\n"+
        offset(4)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+offset(4)+"{\n"+
        offset(5)+"min_dist = std::numeric_limits<double>::max();\n"+
        offset(5)+"best_cluster = k;\n\n"+
        offset(5)+"// Find clostest cluster to this grid point\n"+
        offset(5)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(5)+"{\n"+
        offset(6)+"distance(dist, "+gridViewName+"[tup], means[cluster],"+
        " cluster, &distance_to_mean[0]);\n"+
        offset(6)+"if (dist < min_dist)\n"+offset(6)+"{\n"+
        offset(7)+"min_dist = dist;\n"+offset(7)+"best_cluster = cluster;\n"+
        offset(6)+"}\n"+offset(5)+"}\n"+
        offset(5)+"localClustersChanged[thread_num] = "+
        "localClustersChanged[thread_num] || (assignments[tup] != best_cluster);\n"+
        offset(5)+"assignments[tup] = best_cluster;\n"+
        offset(5)+"localClusterSums[k*thread_num+best_cluster] += "+
        gridViewName+"[tup];\n"+offset(4)+"}\n"+offset(3)+"}\n\n";

    std::string clusterCount = "size_t cluster_count = ",
        clusterChange = "clustersChanged =";
    for (size_t thread = 0; thread < nthreads; ++thread)
    {
        clusterCount += "localClusterSums["+std::to_string(thread)+"*k+cluster].count+";
        clusterChange += " localClustersChanged["+std::to_string(thread)+"] ||";
    }
    clusterCount.pop_back();
    clusterChange.pop_back();
    clusterChange.pop_back();

    clusterCount += ";\n";
    clusterChange += ";\n";
    
    std::string contLocalUpdates = "", categLocalUpdates = "";

    // Compute the one-hot encoding for each categorical variable 
    for (size_t var=0; var < NUM_OF_VARIABLES; ++var)
    {
        if (gridView->_fVars[var])
        {
            Attribute* att = _td->getAttribute(var);
            const std::string& attName = att->_name;

            if (_isCategoricalFeature[var])
            {
                const size_t& origVar = clusterToVariableMap[var];                
                const size_t origViewID =
                    varToQuery[origVar]->_aggregates[0]->_incoming[0].first;
                const std::string origView = "V"+std::to_string(origViewID);
                
                categLocalUpdates +=
                    offset(4)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
                    offset(6)+"means[cluster]."+attName+"[i] = (";

                  for (size_t thread = 0; thread < nthreads; ++thread)
                {
                    categLocalUpdates += "localClusterSums["+std::to_string(thread)+
                        "*k+cluster]."+attName+"[i]+";
                }
                categLocalUpdates.pop_back();
                categLocalUpdates += ") / cluster_count;\n";
            }
            else
            {
                contLocalUpdates += offset(4)+"means[cluster]."+attName+" = (";
                for (size_t thread = 0; thread < nthreads; ++thread)
                {
                    contLocalUpdates += "localClusterSums["+std::to_string(thread)+
                        "*k+cluster]."+attName+"+";
                }
                contLocalUpdates.pop_back();
                contLocalUpdates += ") / cluster_count;\n";
            }
        }
    }
        
    returnString += offset(3)+"// Combine the clusters and update mean\n"+
        offset(3)+clusterChange+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+clusterCount+contLocalUpdates+categLocalUpdates+offset(3)+"}\n";
    
#else // If we are on clang and cannot use openmp

    // Open do loop
    returnString +=
        offset(2)+"do\n"+offset(2)+"{\n"+
        offset(3)+"clustersChanged = false;\n"+
        offset(3)+"// Reset the cluster sums to default values \n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(4)+"cluster_sums[cluster].reset();\n\n"+
        offset(3)+"computeMeanDistance(&distance_to_mean[0], &means[0]);\n\n"+
        offset(3)+"// iterate over grid points and find best cluster for each tuple\n"+
        offset(3)+"for (size_t tup = 0; tup < grid_size; ++tup)\n"+offset(3)+"{\n"+
        offset(4)+"min_dist = std::numeric_limits<double>::max();\n"+
        offset(4)+"best_cluster = k;\n\n"+
        offset(4)+"// Find clostest cluster to this grid point\n"+
        offset(4)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(4)+"{\n"+
        offset(5)+"distance(dist, "+gridViewName+"[tup], means[cluster],"+
        " cluster, &distance_to_mean[0]);\n"+
        offset(5)+"if (dist < min_dist)\n"+offset(5)+"{\n"+
        offset(6)+"min_dist = dist;\n"+offset(6)+"best_cluster = cluster;\n"+
        offset(5)+"}\n"+offset(4)+"}\n"+
        offset(4)+"clustersChanged = clustersChanged || "+
        "(assignments[tup] != best_cluster);\n"+
        offset(4)+"assignments[tup] = best_cluster;\n"+
        offset(4)+"cluster_sums[best_cluster] += "+gridViewName+"[tup];\n"+
        offset(3)+"}\n\n";

    returnString += offset(3)+"// Update the means\n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+"if (cluster_sums[cluster].count == 0)\n"+
        offset(5)+"continue;\n";

    std::string categUpdates = "";
    // Compute the one-hot encoding for each categorical variable 
    for (size_t var=0; var < NUM_OF_VARIABLES; ++var)
    {
        if (gridView->_fVars[var])
        {
            Attribute* att = _td->getAttribute(var);
            const std::string& attName = att->_name;

            if (_isCategoricalFeature[var])
            {
                const size_t& origVar = clusterToVariableMap[var];                
                const size_t origViewID =
                    varToQuery[origVar]->_aggregates[0]->_incoming[0].first;
                const std::string origView = "V"+std::to_string(origViewID);
                
                categUpdates +=
                    offset(4)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
                    offset(6)+"means[cluster]."+attName+"[i] = "+
                    "cluster_sums[cluster]."+attName+"[i] / "+
                    "cluster_sums[cluster].count;\n";
            }
            else
            {
                returnString += offset(4)+"means[cluster]."+attName+" = "+
                    "cluster_sums[cluster]."+attName+" / cluster_sums[cluster].count;\n";
            }
        }
    }

    returnString += categUpdates+offset(3)+"}\n";
#endif

    // returnString += 
    // "//TODO:TODO:check dispersion of the clusters and if clusters have converged\n";

    returnString += offset(3)+"++iteration;\n"+
      offset(2)+"} while(clustersChanged && iteration < 1000);\n\n"+
      offset(2)+"int64_t endProcess = duration_cast<milliseconds>("+
      "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
      offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
      "std::ofstream::app);\n"+
      offset(2)+"ofs << \"\\t\" << endInit << \"\\t\" << endProcess << \"\\t\" << iteration;\n"+
      offset(2)+"ofs.close();\n\n"+
      offset(2)+"std::cout << \"Kmeans Init: \"+"+
      "std::to_string(endInit)+\"ms.\\n\";\n"+
      offset(2)+"std::cout << \"Run kMeans: \"+"+
      "std::to_string(endProcess)+\"ms.\\n\";\n\n";// +
        // offset(2)+"std::cout << \"Number of Iterations: \"+"+
        // "std::to_string(iteration)+\"\\n\";\n\n";
    
    if (INCLUDE_EVALUATION)
        returnString += offset(2)+"evaluateModel(means);\n";
    return returnString+offset(1)+"}\n\n";
}